

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImGuiID __thiscall ImGuiWindow::GetIDFromRectangle(ImGuiWindow *this,ImRect *r_abs)

{
  float fVar1;
  float fVar2;
  ImU32 IVar3;
  long lVar4;
  int r_rel [4];
  int local_18;
  int local_14;
  int local_10;
  int local_c;
  
  lVar4 = (long)(this->IDStack).Size;
  if (0 < lVar4) {
    fVar1 = (this->Pos).x;
    local_18 = (int)((r_abs->Min).x - fVar1);
    fVar2 = (this->Pos).y;
    local_14 = (int)((r_abs->Min).y - fVar2);
    local_10 = (int)((r_abs->Max).x - fVar1);
    local_c = (int)((r_abs->Max).y - fVar2);
    IVar3 = ImHash(&local_18,0x10,(this->IDStack).Data[lVar4 + -1]);
    if (GImGui->ActiveId == IVar3) {
      GImGui->ActiveIdIsAlive = true;
    }
    return IVar3;
  }
  __assert_fail("Size > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.h"
                ,0x4a4,"value_type &ImVector<unsigned int>::back() [T = unsigned int]");
}

Assistant:

ImGuiID ImGuiWindow::GetIDFromRectangle(const ImRect& r_abs)
{
    ImGuiID seed = IDStack.back();
    const int r_rel[4] = { (int)(r_abs.Min.x - Pos.x), (int)(r_abs.Min.y - Pos.y), (int)(r_abs.Max.x - Pos.x), (int)(r_abs.Max.y - Pos.y) };
    ImGuiID id = ImHash(&r_rel, sizeof(r_rel), seed);
    ImGui::KeepAliveID(id);
    return id;
}